

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

void tok_add_define(tokcxdef *ctx,char *sym,int len,char *expan,int explen)

{
  tokdfdef *ptVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  
  ptVar1 = tok_find_define(ctx,sym,len);
  if (ptVar1 == (tokdfdef *)0x0) {
    uVar4 = 0;
    if (len != 0) {
      lVar2 = 0;
      do {
        uVar3 = (int)uVar4 + (uint)(byte)sym[lVar2] & 0x3f;
        uVar4 = (ulong)uVar3;
        lVar2 = lVar2 + 1;
      } while (len != (int)lVar2);
      uVar4 = (ulong)uVar3;
    }
    __n = (size_t)explen;
    ptVar1 = (tokdfdef *)mchalo(ctx->tokcxerr,(long)len + __n + 0x1f,"tok_add_define");
    ptVar1->nm = ptVar1->expan + __n;
    ptVar1->len = len;
    ptVar1->explen = explen;
    memcpy(ptVar1->expan,expan,__n);
    memcpy(ptVar1->expan + __n,sym,(long)len);
    ptVar1->nxt = ctx->tokcxdf[uVar4];
    ctx->tokcxdf[uVar4] = ptVar1;
  }
  return;
}

Assistant:

void tok_add_define(tokcxdef *ctx, char *sym, int len,
                    char *expan, int explen)
{
    int       hsh;
    tokdfdef *df;

    /* if it's already defined, ignore it */
    if (tok_find_define(ctx, sym, len))
        return;

    /* find the appropriate entry in the hash table */
    hsh = tokdfhsh(sym, len);

    /* allocate space for the symbol */
    df = (tokdfdef *)mchalo(ctx->tokcxerr,
                            (sizeof(tokdfdef) + len + explen - 1),
                            "tok_add_define");

    /* set up the new symbol */
    df->nm = df->expan + explen;
    df->len = len;
    df->explen = explen;
    memcpy(df->expan, expan, explen);
    memcpy(df->nm, sym, len);

    /* link it into the hash chain */
    df->nxt = ctx->tokcxdf[hsh];
    ctx->tokcxdf[hsh] = df;
}